

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spread_volatile_semantics.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::SpreadVolatileSemantics::HasInterfaceInConflictOfVolatileSemantics
          (SpreadVolatileSemantics *this)

{
  Module *pMVar1;
  Instruction *this_00;
  IRContext *this_01;
  bool bVar2;
  ExecutionModel execution_model;
  uint32_t uVar3;
  Instruction *pIVar4;
  DefUseManager *this_02;
  Instruction *inst;
  Instruction **ppIVar5;
  uint32_t index;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_88;
  string local_50;
  
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar5 = (Instruction **)
            ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  pIVar4 = (Instruction *)
           ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  do {
    this_00 = *ppIVar5;
    if (this_00 == pIVar4) {
LAB_004611cc:
      return this_00 != pIVar4;
    }
    execution_model = Instruction::GetSingleWordInOperand(this_00,0);
    index = 3;
    while( true ) {
      uVar3 = Instruction::NumInOperands(this_00);
      if (uVar3 <= index) break;
      uVar3 = Instruction::GetSingleWordInOperand(this_00,index);
      EntryFunctionsToSpreadVolatileSemanticsForVar
                ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)&local_88,this,uVar3);
      if (local_88._M_element_count == 0) {
LAB_0046113c:
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&local_88);
      }
      else {
        bVar2 = IsTargetForVolatileSemantics(this,uVar3,execution_model);
        if (bVar2) goto LAB_0046113c;
        bVar2 = IsTargetUsedByNonVolatileLoadInEntryPoint(this,uVar3,this_00);
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&local_88);
        if (bVar2) {
          this_02 = IRContext::get_def_use_mgr((this->super_Pass).context_);
          inst = analysis::DefUseManager::GetDef(this_02,uVar3);
          this_01 = (this->super_Pass).context_;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,
                     "Variable is a target for Volatile semantics for an entry point, but it is not for another entry point"
                     ,(allocator<char> *)&local_88);
          IRContext::EmitErrorMessage(this_01,&local_50,inst);
          std::__cxx11::string::_M_dispose();
          goto LAB_004611cc;
        }
      }
      index = index + 1;
    }
    ppIVar5 = &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  } while( true );
}

Assistant:

bool SpreadVolatileSemantics::HasInterfaceInConflictOfVolatileSemantics() {
  for (Instruction& entry_point : get_module()->entry_points()) {
    spv::ExecutionModel execution_model =
        static_cast<spv::ExecutionModel>(entry_point.GetSingleWordInOperand(0));
    for (uint32_t operand_index = kOpEntryPointInOperandInterface;
         operand_index < entry_point.NumInOperands(); ++operand_index) {
      uint32_t var_id = entry_point.GetSingleWordInOperand(operand_index);
      if (!EntryFunctionsToSpreadVolatileSemanticsForVar(var_id).empty() &&
          !IsTargetForVolatileSemantics(var_id, execution_model) &&
          IsTargetUsedByNonVolatileLoadInEntryPoint(var_id, &entry_point)) {
        Instruction* inst = context()->get_def_use_mgr()->GetDef(var_id);
        context()->EmitErrorMessage(
            "Variable is a target for Volatile semantics for an entry point, "
            "but it is not for another entry point",
            inst);
        return true;
      }
    }
  }
  return false;
}